

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.h
# Opt level: O0

void gimage::fillGammaMap<float>
               (Image<float,_gimage::PixelTraits<float>_> *map,int depth,int from,int to,double g)

{
  bool bVar1;
  long lVar2;
  int in_ECX;
  int in_EDX;
  undefined4 in_ESI;
  Image<float,_gimage::PixelTraits<float>_> *in_RDI;
  double in_XMM0_Qa;
  int i_2;
  int i_1;
  int i;
  work_t in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  long in_stack_ffffffffffffff60;
  Image<float,_gimage::PixelTraits<float>_> *k;
  long in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 uVar3;
  int local_2c;
  int local_28;
  int local_24;
  
  local_24 = 0;
  while( true ) {
    bVar1 = false;
    if (local_24 < in_EDX) {
      lVar2 = Image<float,_gimage::PixelTraits<float>_>::getWidth(in_RDI);
      bVar1 = local_24 < lVar2;
    }
    if (!bVar1) break;
    Image<float,_gimage::PixelTraits<float>_>::absMinValue
              ((Image<float,_gimage::PixelTraits<float>_> *)0x16e186);
    Image<float,_gimage::PixelTraits<float>_>::setLimited
              ((Image<float,_gimage::PixelTraits<float>_> *)
               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
               in_stack_ffffffffffffff58);
    local_24 = local_24 + 1;
  }
  local_28 = 0;
  while( true ) {
    bVar1 = false;
    if (local_28 < in_ECX) {
      lVar2 = Image<float,_gimage::PixelTraits<float>_>::getWidth(in_RDI);
      bVar1 = local_28 < lVar2;
    }
    local_2c = in_ECX;
    if (!bVar1) break;
    Image<float,_gimage::PixelTraits<float>_>::absMaxValue
              ((Image<float,_gimage::PixelTraits<float>_> *)0x16e23f);
    pow((double)(local_28 - in_EDX) / (double)(in_ECX - in_EDX),1.0 / in_XMM0_Qa);
    Image<float,_gimage::PixelTraits<float>_>::setLimited
              ((Image<float,_gimage::PixelTraits<float>_> *)
               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
               in_stack_ffffffffffffff58);
    local_28 = local_28 + 1;
  }
  for (; lVar2 = Image<float,_gimage::PixelTraits<float>_>::getWidth(in_RDI), local_2c < lVar2;
      local_2c = local_2c + 1) {
    lVar2 = (long)local_2c;
    k = in_RDI;
    uVar3 = in_ESI;
    Image<float,_gimage::PixelTraits<float>_>::absMaxValue
              ((Image<float,_gimage::PixelTraits<float>_> *)0x16e323);
    Image<float,_gimage::PixelTraits<float>_>::setLimited
              ((Image<float,_gimage::PixelTraits<float>_> *)
               CONCAT44(uVar3,in_stack_ffffffffffffff70),lVar2,(long)k,in_stack_ffffffffffffff5c,
               in_stack_ffffffffffffff58);
  }
  return;
}

Assistant:

void fillGammaMap(Image<T> &map, int depth, int from, int to, double g)
{
  for (int i=0; i<from && i<map.getWidth(); i++)
  {
    map.setLimited(i, 0, depth, map.absMinValue());
  }

  for (int i=0; i<to && i<map.getWidth(); i++)
  {
    map.setLimited(i, 0, depth, static_cast<T>(map.absMaxValue()*pow(static_cast<double>(i-from)/
                   (to-from), 1.0/g)));
  }

  for (int i=to; i<map.getWidth(); i++)
  {
    map.setLimited(i, 0, depth, map.absMaxValue());
  }
}